

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O3

int amqp_encode_table(amqp_bytes_t encoded,amqp_table_t *input,size_t *offset)

{
  ulong uVar1;
  size_t sVar2;
  undefined8 uVar3;
  size_t sVar4;
  size_t __n;
  void *__src;
  int iVar5;
  uint uVar6;
  amqp_table_entry_t_ *paVar7;
  long lVar8;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  size_t o;
  
  pvVar9 = encoded.bytes;
  uVar10 = encoded.len;
  sVar2 = *offset;
  *offset = sVar2 + 4;
  if (0 < input->num_entries) {
    lVar11 = 0x10;
    lVar8 = 0;
    do {
      uVar3 = *(undefined8 *)((long)input->entries + lVar11 + -0x10);
      sVar4 = *offset;
      uVar1 = sVar4 + 1;
      *offset = uVar1;
      if (uVar10 < uVar1) {
        return -0xb;
      }
      *(char *)((long)pvVar9 + sVar4) = (char)uVar3;
      paVar7 = input->entries;
      __n = *(size_t *)((long)paVar7 + lVar11 + -0x10);
      if (__n != 0) {
        __src = *(void **)((long)paVar7 + lVar11 + -8);
        sVar4 = *offset;
        uVar1 = sVar4 + __n;
        *offset = uVar1;
        if (uVar10 < uVar1) {
          return -0xb;
        }
        memcpy((void *)(sVar4 + (long)pvVar9),__src,__n);
        paVar7 = input->entries;
      }
      iVar5 = amqp_encode_field_value
                        (encoded,(amqp_field_value_t *)((long)&(paVar7->key).len + lVar11),offset);
      if (iVar5 < 0) {
        return iVar5;
      }
      lVar8 = lVar8 + 1;
      lVar11 = lVar11 + 0x28;
    } while (lVar8 < input->num_entries);
  }
  iVar5 = -0xb;
  if (sVar2 + 4 <= uVar10) {
    uVar6 = ((int)*offset - (int)sVar2) - 4;
    *(uint *)((long)pvVar9 + sVar2) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 * 0x1000000;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int amqp_encode_table(amqp_bytes_t encoded, amqp_table_t *input,
                      size_t *offset) {
  size_t start = *offset;
  int i, res;

  *offset += 4; /* size of the table gets filled in later on */

  for (i = 0; i < input->num_entries; i++) {
    if (!amqp_encode_8(encoded, offset, (uint8_t)input->entries[i].key.len)) {
      res = AMQP_STATUS_TABLE_TOO_BIG;
      goto out;
    }

    if (!amqp_encode_bytes(encoded, offset, input->entries[i].key)) {
      res = AMQP_STATUS_TABLE_TOO_BIG;
      goto out;
    }

    res = amqp_encode_field_value(encoded, &input->entries[i].value, offset);
    if (res < 0) {
      goto out;
    }
  }

  if (!amqp_encode_32(encoded, &start, (uint32_t)(*offset - start - 4))) {
    res = AMQP_STATUS_TABLE_TOO_BIG;
    goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}